

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseRoot(Parser *this,char *source,char **include_paths,char *source_filename)

{
  int *piVar1;
  int iVar2;
  StructDef *this_00;
  Namespace *pNVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
  *this_01;
  EnumDef *pEVar7;
  iterator __position;
  undefined8 *puVar8;
  long *plVar9;
  _Base_ptr *pp_Var10;
  size_type *psVar11;
  long *plVar12;
  int t;
  BaseType *pBVar13;
  long *plVar14;
  undefined8 *__src;
  long *plVar15;
  undefined8 *puVar16;
  _Base_ptr p_Var17;
  undefined8 uVar18;
  char *in_R8;
  size_t max_components;
  CheckedError *ce;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> err;
  undefined1 local_120 [32];
  Parser *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  pointer local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Base_ptr local_a8;
  _Base_ptr p_Stack_a0;
  string local_98;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
  *local_78;
  _Base_ptr *local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr p_Stack_58;
  string local_50;
  
  DoParse(this,source,include_paths,source_filename,in_R8);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    puVar16 = *(undefined8 **)(source + 0xd8);
    puVar8 = *(undefined8 **)(source + 0xe0);
    local_100 = this;
    if (puVar16 != puVar8) {
      local_78 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
                  *)(source + 0xa8);
      do {
        this_00 = (StructDef *)*puVar16;
        if (this_00->predecl == true) {
          if ((source[0x3f9] == '\x01') &&
             (pNVar3 = (this_00->super_Definition).defined_namespace,
             max_components =
                  (long)(pNVar3->components).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pNVar3->components).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5,
             max_components != 0xffffffffffffffff)) {
            do {
              Namespace::GetFullyQualifiedName
                        ((string *)local_120,(this_00->super_Definition).defined_namespace,
                         (string *)this_00,max_components);
              pEVar7 = LookupEnum((Parser *)source,(string *)local_120);
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
              }
              this_01 = local_78;
              bVar19 = max_components != 0;
              max_components = max_components - 1;
            } while ((bVar19) && (pEVar7 == (EnumDef *)0x0));
            if (pEVar7 != (EnumDef *)0x0) {
              iVar2 = (this_00->super_Definition).refcount;
              plVar9 = *(long **)(source + 0xd8);
              plVar15 = *(long **)(source + 0xe0);
              t = iVar2;
              if (plVar9 != plVar15) {
                do {
                  lVar4 = *plVar9;
                  plVar12 = *(long **)(lVar4 + 0xf8);
                  plVar14 = *(long **)(lVar4 + 0x100);
                  if (plVar12 != plVar14) {
                    do {
                      lVar5 = *plVar12;
                      if (*(StructDef **)(lVar5 + 0xd0) == this_00) {
                        *(undefined8 *)(lVar5 + 0xd0) = 0;
                        *(EnumDef **)(lVar5 + 0xd8) = pEVar7;
                        bVar19 = (*(int *)(lVar5 + 200) - 0xeU & 0xfffffffb) == 0;
                        pBVar13 = (BaseType *)(lVar5 + 0xcc);
                        if (!bVar19) {
                          pBVar13 = (BaseType *)(lVar5 + 200);
                        }
                        if (*(int *)(lVar5 + 200 + (ulong)bVar19 * 4) != 0xf) {
                          __assert_fail("bt == BASE_TYPE_STRUCT",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                                        ,0xdd3,
                                        "CheckedError flatbuffers::Parser::ParseRoot(const char *, const char **, const char *)"
                                       );
                        }
                        *pBVar13 = (pEVar7->underlying_type).base_type;
                        piVar1 = &(this_00->super_Definition).refcount;
                        *piVar1 = *piVar1 + -1;
                        piVar1 = &(pEVar7->super_Definition).refcount;
                        *piVar1 = *piVar1 + 1;
                        plVar14 = *(long **)(lVar4 + 0x100);
                      }
                      plVar12 = plVar12 + 1;
                    } while (plVar12 != plVar14);
                    plVar15 = *(long **)(source + 0xe0);
                  }
                  plVar9 = plVar9 + 1;
                } while (plVar9 != plVar15);
                t = (this_00->super_Definition).refcount;
              }
              if (t == 0) {
                __position = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                                     *)local_78,(key_type *)this_00);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
                ::erase_abi_cxx11_(this_01,__position);
                __src = puVar16 + 1;
                puVar8 = *(undefined8 **)(source + 0xe0);
                if (__src != puVar8) {
                  memmove(puVar16,__src,(long)puVar8 - (long)__src);
                  puVar8 = *(undefined8 **)(source + 0xe0);
                }
                *(undefined8 **)(source + 0xe0) = puVar8 + -1;
                StructDef::~StructDef(this_00);
                operator_delete(this_00,0x148);
                puVar8 = *(undefined8 **)(source + 0xe0);
                goto LAB_0012cd4f;
              }
              NumToString<int>(&local_50,t);
              plVar9 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_50,0,(char *)0x0,0x3594ab);
              pp_Var10 = (_Base_ptr *)(plVar9 + 2);
              if ((_Base_ptr *)*plVar9 == pp_Var10) {
                local_60 = *pp_Var10;
                p_Stack_58 = (_Base_ptr)plVar9[3];
                local_70 = &local_60;
              }
              else {
                local_60 = *pp_Var10;
                local_70 = (_Base_ptr *)*plVar9;
              }
              local_68 = (_Base_ptr)plVar9[1];
              *plVar9 = (long)pp_Var10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
              pp_Var10 = (_Base_ptr *)(plVar9 + 2);
              if ((_Base_ptr *)*plVar9 == pp_Var10) {
                local_a8 = *pp_Var10;
                p_Stack_a0 = (_Base_ptr)plVar9[3];
                local_c8.field_2._M_allocated_capacity = (size_type)&local_a8;
              }
              else {
                local_a8 = *pp_Var10;
                local_c8.field_2._M_allocated_capacity = (size_type)(_Base_ptr *)*plVar9;
              }
              local_c8.field_2._8_8_ = plVar9[1];
              *plVar9 = (long)pp_Var10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              NumToString<int>(&local_98,iVar2);
              p_Var17 = (_Base_ptr)0xf;
              if ((_Base_ptr *)local_c8.field_2._M_allocated_capacity != &local_a8) {
                p_Var17 = local_a8;
              }
              if (p_Var17 < (_Base_ptr)(local_98._M_string_length + local_c8.field_2._8_8_)) {
                uVar18 = (_Base_ptr)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  uVar18 = local_98.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 < (_Base_ptr)(local_98._M_string_length + local_c8.field_2._8_8_))
                goto LAB_0012d044;
                plVar9 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_98,0,(char *)0x0,
                                            local_c8.field_2._M_allocated_capacity);
              }
              else {
LAB_0012d044:
                plVar9 = (long *)std::__cxx11::string::_M_append
                                           (local_c8.field_2._M_local_buf,
                                            (ulong)local_98._M_dataplus._M_p);
              }
              local_d8 = &local_c8;
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar9 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9 ==
                  pbVar6) {
                local_c8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                local_c8._M_string_length = plVar9[3];
              }
              else {
                local_c8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar9;
              }
              local_d0 = (pointer)plVar9[1];
              *plVar9 = (long)pbVar6;
              plVar9[1] = 0;
              *(undefined1 *)&(pbVar6->_M_dataplus)._M_p = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
              psVar11 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_f8.field_2._M_allocated_capacity = *psVar11;
                local_f8.field_2._8_8_ = plVar9[3];
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              }
              else {
                local_f8.field_2._M_allocated_capacity = *psVar11;
                local_f8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_f8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_f8,
                                          (ulong)(pEVar7->super_Definition).name._M_dataplus._M_p);
              local_120._0_8_ = local_120 + 0x10;
              psVar11 = (size_type *)(plVar9 + 2);
              if ((size_type *)*plVar9 == psVar11) {
                local_120._16_8_ = *psVar11;
                local_120._24_8_ = plVar9[3];
              }
              else {
                local_120._16_8_ = *psVar11;
                local_120._0_8_ = (size_type *)*plVar9;
              }
              local_120._8_8_ = plVar9[1];
              *plVar9 = (long)psVar11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              Error(local_100,(string *)source);
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,(ulong)(local_c8._M_dataplus._M_p + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,
                                (ulong)(local_98.field_2._M_allocated_capacity + 1));
              }
              if ((_Base_ptr *)local_c8.field_2._M_allocated_capacity != &local_a8) {
                operator_delete((void *)local_c8.field_2._M_allocated_capacity,
                                (ulong)((long)&local_a8->_M_color + 1));
              }
              if (local_70 != &local_60) {
                operator_delete(local_70,(ulong)((long)&local_60->_M_color + 1));
              }
              this = local_100;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0012ceea:
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0012cef2;
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120,"type referenced but not defined (check namespace): ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
          this = local_100;
          pbVar6 = (this_00->original_location)._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::operator+(&local_f8,", originally at: ",pbVar6);
            std::__cxx11::string::_M_append(local_120,(ulong)local_f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
          }
          Error(this,(string *)source);
          local_50.field_2._M_allocated_capacity = local_120._16_8_;
          local_50._M_dataplus._M_p = (pointer)local_120._0_8_;
          if ((undefined1 *)local_120._0_8_ == local_120 + 0x10) goto LAB_0012cef2;
          goto LAB_0012ceea;
        }
        puVar16 = puVar16 + 1;
LAB_0012cd4f:
      } while (puVar16 != puVar8);
    }
    this = local_100;
    plVar9 = *(long **)(source + 0x120);
    if (plVar9 != *(long **)(source + 0x128)) {
      do {
        lVar4 = *plVar9;
        if (*(char *)(lVar4 + 200) == '\x01') {
          for (puVar16 = *(undefined8 **)(lVar4 + 0x120); puVar16 != *(undefined8 **)(lVar4 + 0x128)
              ; puVar16 = puVar16 + 1) {
            if ((*(ulong *)(source + 0x680) & 0xfffffffffff47c34) != 0 ||
                *(ulong *)(source + 0x680) == 0) {
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar16
              ;
              iVar2 = *(int *)((long)&pbVar6[1].field_2 + 8);
              if (iVar2 == 0xf) {
                if (pbVar6[2]._M_dataplus._M_p[0x110] == '\x01') goto LAB_0012ceb5;
              }
              else if (iVar2 == 0xd) {
LAB_0012ceb5:
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_120,
                               "only tables can be union elements in the generated language: ",
                               pbVar6);
                Error(this,(string *)source);
                local_50.field_2._M_allocated_capacity = local_120._16_8_;
                local_50._M_dataplus._M_p = (pointer)local_120._0_8_;
                if ((undefined1 *)local_120._0_8_ == local_120 + 0x10) goto LAB_0012cef2;
                goto LAB_0012ceea;
              }
            }
          }
        }
        plVar9 = plVar9 + 1;
      } while (plVar9 != *(long **)(source + 0x128));
    }
    CheckPrivateLeak((Parser *)local_120);
    if (local_120[0] == '\0') {
      if (*(int *)(source + 0x1c) == 0x7b) {
        DoParseJson(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012cef2;
      }
      local_120[0] = '\0';
    }
    *(char *)&(this->super_ParserState).prev_cursor_ = local_120[0];
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 0;
  }
LAB_0012cef2:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseRoot(const char *source, const char **include_paths,
                               const char *source_filename) {
  ECHECK(DoParse(source, include_paths, source_filename, nullptr));

  // Check that all types were defined.
  for (auto it = structs_.vec.begin(); it != structs_.vec.end();) {
    auto &struct_def = **it;
    if (struct_def.predecl) {
      if (opts.proto_mode) {
        // Protos allow enums to be used before declaration, so check if that
        // is the case here.
        EnumDef *enum_def = nullptr;
        for (size_t components =
                 struct_def.defined_namespace->components.size() + 1;
             components && !enum_def; components--) {
          auto qualified_name =
              struct_def.defined_namespace->GetFullyQualifiedName(
                  struct_def.name, components - 1);
          enum_def = LookupEnum(qualified_name);
        }
        if (enum_def) {
          // This is pretty slow, but a simple solution for now.
          auto initial_count = struct_def.refcount;
          for (auto struct_it = structs_.vec.begin();
               struct_it != structs_.vec.end(); ++struct_it) {
            auto &sd = **struct_it;
            for (auto field_it = sd.fields.vec.begin();
                 field_it != sd.fields.vec.end(); ++field_it) {
              auto &field = **field_it;
              if (field.value.type.struct_def == &struct_def) {
                field.value.type.struct_def = nullptr;
                field.value.type.enum_def = enum_def;
                auto &bt = IsVector(field.value.type)
                               ? field.value.type.element
                               : field.value.type.base_type;
                FLATBUFFERS_ASSERT(bt == BASE_TYPE_STRUCT);
                bt = enum_def->underlying_type.base_type;
                struct_def.refcount--;
                enum_def->refcount++;
              }
            }
          }
          if (struct_def.refcount)
            return Error("internal: " + NumToString(struct_def.refcount) + "/" +
                         NumToString(initial_count) +
                         " use(s) of pre-declaration enum not accounted for: " +
                         enum_def->name);
          structs_.dict.erase(structs_.dict.find(struct_def.name));
          it = structs_.vec.erase(it);
          delete &struct_def;
          continue;  // Skip error.
        }
      }
      auto err = "type referenced but not defined (check namespace): " +
                 struct_def.name;
      if (struct_def.original_location)
        err += ", originally at: " + *struct_def.original_location;
      return Error(err);
    }
    ++it;
  }

  // This check has to happen here and not earlier, because only now do we
  // know for sure what the type of these are.
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto &enum_def = **it;
    if (enum_def.is_union) {
      for (auto val_it = enum_def.Vals().begin();
           val_it != enum_def.Vals().end(); ++val_it) {
        auto &val = **val_it;

        if (!(opts.lang_to_generate != 0 && SupportsAdvancedUnionFeatures()) &&
            (IsStruct(val.union_type) || IsString(val.union_type)))

          return Error(
              "only tables can be union elements in the generated language: " +
              val.name);
      }
    }
  }

  auto err = CheckPrivateLeak();
  if (err.Check()) return err;

  // Parse JSON object only if the scheme has been parsed.
  if (token_ == '{') { ECHECK(DoParseJson()); }
  return NoError();
}